

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.c
# Opt level: O3

void graphics_init(void)

{
  int iVar1;
  
  printf("Init graphics system...");
  iVar1 = registerfarbgidriver(0);
  if (-1 < iVar1) {
    screen_byte_P = text_screen_byte;
    puts("Done");
    return;
  }
  puts("\nUnable to Initialise Graphics");
  printf("This software requires VGA/EGA");
  exit(1);
}

Assistant:

void graphics_init(void) {
    signed int errorcode;
    printf("Init graphics system...");       // display pretty startup info
    errorcode = registerfarbgidriver(EGAVGA_driver_far); // initialise the graphics
    if (errorcode < 0)                                   // system. check for error
    {
        printf("\nUnable to Initialise Graphics\n");        // if unable to init,
        printf("This software requires VGA/EGA");       // print error
        exit(1);                                        // and exit
    }

    screen_byte_P = text_screen_byte;     // point screen access function for text
    printf("Done\n");                   // display pretty startup info

}